

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::detectinterfaces(tetgenmesh *this)

{
  uint uVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  undefined8 in_RAX;
  shellface **subfacearray;
  shellface *pppdVar4;
  undefined8 *puVar5;
  long lVar6;
  int internum;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (this->b->quiet == 0) {
    puts("Detecting self-intersecting facets...");
  }
  pmVar2 = this->subfaces;
  subfacearray = (shellface **)
                 operator_new__(-(ulong)((ulong)pmVar2->items >> 0x3d != 0) | pmVar2->items << 3);
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  do {
    pppdVar4 = (shellface *)memorypool::traverse(pmVar2);
    if (pppdVar4 == (shellface *)0x0) {
LAB_0012b161:
      uStack_28 = (ulong)(uint)uStack_28;
      interecursive(this,subfacearray,(int)this->subfaces->items,0,this->xmin,this->xmax,this->ymin,
                    this->ymax,this->zmin,this->zmax,(int *)((long)&uStack_28 + 4));
      if (this->b->quiet == 0) {
        if (uStack_28._4_4_ < 1) {
          puts("\nNo faces are intersecting.\n");
        }
        else {
          printf("\n!! Found %d pairs of faces are intersecting.\n\n");
        }
      }
      pmVar2 = this->subfaces;
      if (uStack_28._4_4_ < 1) {
        pmVar2->items = 0;
        pmVar2->maxitems = 0;
        ppvVar3 = pmVar2->firstblock;
        pmVar2->nowblock = ppvVar3;
        pmVar2->nextitem =
             (void *)((long)ppvVar3 +
                     (((long)pmVar2->alignbytes + 8U) -
                     (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
        pmVar2->unallocateditems = pmVar2->itemsperblock;
        pmVar2->deaditemstack = (void *)0x0;
      }
      else {
        ppvVar3 = pmVar2->firstblock;
        pmVar2->pathblock = ppvVar3;
        pmVar2->pathitem =
             (void *)((long)ppvVar3 +
                     (((long)pmVar2->alignbytes + 8U) -
                     (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
        pmVar2->pathitemsleft = pmVar2->itemsperblock;
        while (puVar5 = (undefined8 *)memorypool::traverse(pmVar2), puVar5 != (undefined8 *)0x0) {
          if (puVar5[3] != 0) {
            do {
              uVar1 = *(uint *)((long)puVar5 + (long)this->shmarkindex * 4 + 4);
              if ((uVar1 & 1) == 0) {
                pmVar2 = this->subfaces;
                puVar5[3] = 0;
                *puVar5 = pmVar2->deaditemstack;
                pmVar2->deaditemstack = puVar5;
                pmVar2->items = pmVar2->items + -1;
              }
              else {
                *(uint *)((long)puVar5 + (long)this->shmarkindex * 4 + 4) = uVar1 & 0xfffffffe;
              }
              pmVar2 = this->subfaces;
              do {
                puVar5 = (undefined8 *)memorypool::traverse(pmVar2);
                if (puVar5 == (undefined8 *)0x0) {
                  return;
                }
              } while (puVar5[3] == 0);
            } while( true );
          }
        }
      }
      return;
    }
  } while (pppdVar4[3] == (shellface)0x0);
  lVar6 = 0;
  do {
    subfacearray[lVar6] = pppdVar4;
    pmVar2 = this->subfaces;
    do {
      pppdVar4 = (shellface *)memorypool::traverse(pmVar2);
      if (pppdVar4 == (shellface *)0x0) goto LAB_0012b161;
    } while (pppdVar4[3] == (shellface)0x0);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void tetgenmesh::detectinterfaces()
{
  shellface **subfacearray;
  face shloop;
  int internum;
  int i;

  if (!b->quiet) {
    printf("Detecting self-intersecting facets...\n");
  }

  // Construct a map from indices to subfaces;
  subfacearray = new shellface*[subfaces->items];
  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  i = 0;
  while (shloop.sh != (shellface *) NULL) {
    subfacearray[i] = shloop.sh;
    shloop.sh = shellfacetraverse(subfaces);
    i++;
  }

  internum = 0;
  // Recursively split the set of triangles into two sets using a cut plane
  //   parallel to x-, or, y-, or z-axis.  Stop splitting when the number
  //   of subfaces is not decreasing anymore. Do tests on the current set.
  interecursive(subfacearray, subfaces->items, 0, xmin, xmax, ymin, ymax,
                zmin, zmax, &internum);

  if (!b->quiet) {
    if (internum > 0) {
      printf("\n!! Found %d pairs of faces are intersecting.\n\n", internum);
    } else {
      printf("\nNo faces are intersecting.\n\n");
    }
  }

  if (internum > 0) {
    // Traverse all subfaces, deallocate those have not been infected (they
    //   are not intersecting faces). Uninfect those have been infected.
    //   After this loop, only intersecting faces remain.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      if (sinfected(shloop)) {
        suninfect(shloop);
      } else {
        shellfacedealloc(subfaces, shloop.sh);
      }
      shloop.sh = shellfacetraverse(subfaces);
    }
  } else {
    // Deallocate all subfaces.
    subfaces->restart();
  }
}